

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O2

reference __thiscall
jsoncons::jmespath::detail::
jmespath_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::filter_expression::evaluate
          (filter_expression *this,reference val,
          eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *context,error_code *ec)

{
  bool bVar1;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  pointer pbVar2;
  reference this_01;
  reference pbVar3;
  iterator doc;
  const_array_range_type cVar4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> j;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  new_context;
  iterator local_88;
  reference local_80;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> local_78;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_68;
  
  bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array(val);
  if (bVar1) {
    this_00 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
              eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
              ::create_json<jsoncons::json_array_arg_t_const&>
                        ((eval_context<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                          *)context,(json_array_arg_t *)&json_array_arg);
    cVar4 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::array_range
                      (val);
    while (local_88 = cVar4.last_._M_current, doc = cVar4.first_._M_current,
          doc._M_current != local_88._M_current) {
      local_68.temp_storage_ = context->temp_storage_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
      ::_Rb_tree(&local_68.variables_._M_t,&(context->variables_)._M_t);
      pbVar2 = evaluate_tokens(doc._M_current,&this->token_list_,&local_68,ec);
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (&local_78,pbVar2);
      bVar1 = is_true(&local_78);
      if (bVar1) {
        this_01 = projection_base::apply_expressions
                            (&this->super_projection_base,doc._M_current,context,ec);
        bVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_null
                          (this_01);
        if (!bVar1) {
          local_80 = this_01;
          basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
          emplace_back<jsoncons::json_const_pointer_arg_t_const&,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const*>
                    (this_00,(json_const_pointer_arg_t *)&json_const_pointer_arg,&local_80);
        }
      }
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
                (&local_78);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*>_>_>
      ::~_Rb_tree(&local_68.variables_._M_t);
      cVar4.last_._M_current = local_88._M_current;
      cVar4.first_._M_current = doc._M_current + 1;
    }
    return (reference)this_00;
  }
  pbVar3 = eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           ::null_value(context);
  return pbVar3;
}

Assistant:

reference evaluate(reference val, eval_context<Json>& context, std::error_code& ec) const override
            {
                if (!val.is_array())
                {
                    return context.null_value();
                }
                auto result = context.create_json(json_array_arg);

                for (auto& item : val.array_range())
                {
                    eval_context<Json> new_context{ context.temp_storage_, context.variables_ };
                    Json j(json_const_pointer_arg, evaluate_tokens(item, token_list_, new_context, ec));
                    if (is_true(j))
                    {
                        reference jj = this->apply_expressions(item, context, ec);
                        if (!jj.is_null())
                        {
                            result->emplace_back(json_const_pointer_arg, std::addressof(jj));
                        }
                    }
                }
                return *result;
            }